

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_import_bits(void)

{
  value_type_conflict3 *pvVar1;
  undefined1 *puVar2;
  number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  array<unsigned_int,_8UL> *this;
  array<unsigned_int,_7UL> *this_00;
  undefined8 uVar4;
  __type _Var5;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar6;
  uint uVar7;
  unsigned_long uVar8;
  const_iterator pvVar9;
  representation_type *prVar10;
  iterator puVar11;
  iterator puVar12;
  const_iterator puVar13;
  const_iterator puVar14;
  const_iterator pvVar15;
  iterator pvVar16;
  unsigned_short *puVar17;
  unsigned_short *hi;
  const_iterator pvVar18;
  const_iterator pvVar19;
  array<unsigned_short,_16UL> *paVar20;
  iterator __result;
  iterator pvVar21;
  reference lo;
  reference hi_00;
  const_iterator pvVar22;
  const_iterator pvVar23;
  size_type sVar24;
  const_iterator first;
  const_iterator last;
  const_reference pvVar25;
  uintwide_t<256U,_unsigned_short,_void,_false> *x;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_01;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_02;
  ulong in_R8;
  bool local_609;
  bool local_5f9;
  bool local_5a9;
  bool local_569;
  bool local_533;
  bool local_531;
  undefined1 local_4f8 [7];
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> result_import_is_ok;
  local_uintwide_t_small_unsigned_type u;
  size_t i_4;
  array<unsigned_int,_1UL> bits_in;
  __type result_import_bits_is_ok_3;
  string str_boost_3;
  string str_uintwide_t_3;
  local_boost_small_uint_type val_boost_3;
  local_uintwide_t_small_unsigned_type val_uintwide_t_3;
  local_size_type index_plus_one_1;
  value_type_conflict *elem_1;
  iterator __end4_1;
  iterator __begin4_1;
  local_double_width_less_wide_input_array_type *__range4_1;
  local_size_type index_1;
  local_double_width_less_wide_input_array_type bits_double_width_1;
  local_representation_less_wide_type bits_3;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen_3;
  uint i_3;
  value_type_conflict1 *msv_first_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  array<bool,_2UL> *__range1_3;
  undefined1 local_388 [7];
  __type result_import_bits_is_ok_2;
  string str_boost_2;
  string str_uintwide_t_2;
  local_boost_small_uint_type val_boost_2;
  local_uintwide_t_small_unsigned_type val_uintwide_t_2;
  local_size_type index_plus_one;
  value_type_conflict *elem;
  iterator __end4;
  iterator __begin4;
  local_double_width_input_array_type *__range4;
  local_size_type index;
  local_double_width_input_array_type bits_double_width;
  local_representation_type bits_2;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen_2;
  uint i_2;
  value_type_conflict1 *msv_first_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  array<bool,_2UL> *__range1_2;
  undefined1 local_238 [7];
  __type result_import_bits_is_ok_1;
  string str_boost_1;
  string str_uintwide_t_1;
  local_boost_small_uint_type val_boost_1;
  local_uintwide_t_small_unsigned_type val_uintwide_t_1;
  local_representation_type bits_1;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen_1;
  uint i_1;
  value_type_conflict *chunk_size;
  const_iterator __end2;
  const_iterator __begin2;
  array<unsigned_int,_3UL> *__range2;
  value_type_conflict1 *msv_first_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<bool,_2UL> *__range1_1;
  bool result_import_bits_is_ok;
  undefined1 local_110 [8];
  string str_boost;
  string str_uintwide_t;
  number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
  local_c8 [4];
  uint oscillated_chunk_size;
  local_boost_small_uint_type val_boost;
  local_uintwide_t_small_unsigned_type val_uintwide_t;
  local_representation_type bits;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen;
  uint i;
  value_type_conflict1 *msv_first;
  const_iterator __end1;
  const_iterator __begin1;
  array<bool,_2UL> *__range1;
  bool result_is_ok;
  
  uVar8 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
          *)eng_sgn,uVar8);
  uVar8 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
          *)eng_dig,uVar8);
  __range1._7_1_ = true;
  __end1 = std::array<bool,_2UL>::begin(&test_import_bits::msv_options);
  pvVar9 = std::array<bool,_2UL>::end(&test_import_bits::msv_options);
  for (; __end1 != pvVar9; __end1 = __end1 + 1) {
    u_gen.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    u_gen.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    for (; (uint)u_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x40;
        u_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
             u_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (bits.super_array<unsigned_short,_16UL>.elems + 0xc),(test_uintwide_t_edge *)0x1,
                 false,0x4d,(int)in_R8);
      prVar10 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::crepresentation
                          ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                           (bits.super_array<unsigned_short,_16UL>.elems + 0xc));
      unique0x00012000 = *(undefined8 *)(prVar10->super_array<unsigned_short,_16UL>).elems;
      bits.super_array<unsigned_short,_16UL>.elems._0_8_ =
           *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 4);
      bits.super_array<unsigned_short,_16UL>.elems._8_8_ =
           *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 8);
      bits.super_array<unsigned_short,_16UL>.elems._16_8_ =
           *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 0xc);
      if ((*__end1 & 1U) != 0) {
        puVar11 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::begin
                            ((array<unsigned_short,_16UL> *)
                             (val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems + 0xe));
        puVar12 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::end
                            ((array<unsigned_short,_16UL> *)
                             (val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems + 0xe));
        std::reverse<unsigned_short*>(puVar11,puVar12);
      }
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      ._40_8_ = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
      puVar2 = &val_boost.m_backend.
                super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .field_0x28;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
      ::number((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_c8);
      uVar7 = (uint)((u_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ & 1) == 0) << 4;
      pvVar1 = val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems + 0xe;
      puVar13 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                          ((array<unsigned_short,_16UL> *)pvVar1);
      puVar14 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cend
                          ((array<unsigned_short,_16UL> *)pvVar1);
      math::wide_integer::import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2,puVar13,puVar14,uVar7,
                 (bool)(*__end1 & 1));
      puVar13 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                          ((array<unsigned_short,_16UL> *)pvVar1);
      puVar14 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cend
                          ((array<unsigned_short,_16UL> *)pvVar1);
      in_R8 = (ulong)(*__end1 & 1);
      boost::multiprecision::
      import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_c8,puVar13,puVar14,uVar7,SUB41(*__end1 & 1,0));
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)((long)&str_boost.field_2 + 8),(wide_integer *)puVar2,x);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
      ::str_abi_cxx11_((string *)local_110,local_c8,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&str_boost.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110);
      local_531 = false;
      if (_Var5) {
        local_531 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                               (bits.super_array<unsigned_short,_16UL>.elems + 0xc),
                               (uintwide_t<256U,_unsigned_short,_void,_false> *)
                               &val_boost.m_backend.
                                super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                                .field_0x28);
      }
      local_533 = false;
      if (local_531 != false) {
        local_533 = __range1._7_1_;
      }
      __range1._7_1_ = local_533;
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(str_boost.field_2._M_local_buf + 8));
    }
  }
  __end1_1 = std::array<bool,_2UL>::begin(&test_import_bits::msv_options);
  pvVar9 = std::array<bool,_2UL>::end(&test_import_bits::msv_options);
  for (; __end1_1 != pvVar9; __end1_1 = __end1_1 + 1) {
    __end2 = std::array<unsigned_int,_3UL>::begin(&test_import_bits::bits_for_chunks);
    pvVar15 = std::array<unsigned_int,_3UL>::end(&test_import_bits::bits_for_chunks);
    for (; __end2 != pvVar15; __end2 = __end2 + 1) {
      u_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
      u_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
      for (; (uint)u_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x40;
          u_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
               u_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
        generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                   (bits_1.super_array<unsigned_short,_16UL>.elems + 0xc),
                   (test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
        prVar10 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::crepresentation
                            ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                             (bits_1.super_array<unsigned_short,_16UL>.elems + 0xc));
        unique0x00012000 = *(undefined8 *)(prVar10->super_array<unsigned_short,_16UL>).elems;
        bits_1.super_array<unsigned_short,_16UL>.elems._0_8_ =
             *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 4);
        bits_1.super_array<unsigned_short,_16UL>.elems._8_8_ =
             *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 8);
        bits_1.super_array<unsigned_short,_16UL>.elems._16_8_ =
             *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 0xc);
        if ((*__end1_1 & 1U) != 0) {
          puVar11 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::begin
                              ((array<unsigned_short,_16UL> *)
                               (val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems +
                               0xe));
          puVar12 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::end
                              ((array<unsigned_short,_16UL> *)
                               (val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems +
                               0xe));
          std::reverse<unsigned_short*>(puVar11,puVar12);
        }
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
        val_boost_1.m_backend.
        super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
        ._40_8_ = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
        val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
        puVar2 = &val_boost_1.m_backend.
                  super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                  .field_0x28;
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2);
        pnVar3 = (number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                  *)(str_uintwide_t_1.field_2._M_local_buf + 8);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
        ::number((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)pnVar3);
        pvVar1 = val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems + 0xe;
        puVar13 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                            ((array<unsigned_short,_16UL> *)pvVar1);
        puVar14 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cend
                            ((array<unsigned_short,_16UL> *)pvVar1);
        math::wide_integer::import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2,puVar13,puVar14,*__end2,
                   (bool)(*__end1_1 & 1));
        puVar13 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                            ((array<unsigned_short,_16UL> *)pvVar1);
        puVar14 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cend
                            ((array<unsigned_short,_16UL> *)pvVar1);
        in_R8 = (ulong)(*__end1_1 & 1);
        boost::multiprecision::
        import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pnVar3,puVar13,puVar14,*__end2,SUB41(*__end1_1 & 1,0));
        math::wide_integer::to_string<256u,unsigned_short,void,false>
                  ((string *)((long)&str_boost_1.field_2 + 8),(wide_integer *)puVar2,x_00);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
        ::str_abi_cxx11_((string *)local_238,pnVar3,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&str_boost_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_238);
        local_569 = false;
        if (_Var5) {
          local_569 = __range1._7_1_;
        }
        __range1._7_1_ = local_569;
        std::__cxx11::string::~string((string *)local_238);
        std::__cxx11::string::~string((string *)(str_boost_1.field_2._M_local_buf + 8));
      }
    }
  }
  __end1_2 = std::array<bool,_2UL>::begin(&test_import_bits::msv_options);
  pvVar9 = std::array<bool,_2UL>::end(&test_import_bits::msv_options);
  for (; __end1_2 != pvVar9; __end1_2 = __end1_2 + 1) {
    u_gen_2.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    u_gen_2.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    for (; (uint)u_gen_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x40;
        u_gen_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
             u_gen_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (bits_2.super_array<unsigned_short,_16UL>.elems + 0xc),(test_uintwide_t_edge *)0x1,
                 false,0x4d,(int)in_R8);
      prVar10 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::crepresentation
                          ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                           (bits_2.super_array<unsigned_short,_16UL>.elems + 0xc));
      bits_double_width._M_elems._24_8_ =
           *(undefined8 *)(prVar10->super_array<unsigned_short,_16UL>).elems;
      bits_2.super_array<unsigned_short,_16UL>.elems._0_8_ =
           *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 4);
      bits_2.super_array<unsigned_short,_16UL>.elems._8_8_ =
           *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 8);
      bits_2.super_array<unsigned_short,_16UL>.elems._16_8_ =
           *(undefined8 *)((prVar10->super_array<unsigned_short,_16UL>).elems + 0xc);
      __range4._0_4_ = 0;
      __end4 = std::array<unsigned_int,_8UL>::begin
                         ((array<unsigned_int,_8UL> *)((long)&__range4 + 4));
      pvVar16 = std::array<unsigned_int,_8UL>::end
                          ((array<unsigned_int,_8UL> *)((long)&__range4 + 4));
      for (; __end4 != pvVar16; __end4 = __end4 + 1) {
        uVar7 = (uint)__range4 + 1;
        puVar13 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                            ((array<unsigned_short,_16UL> *)(bits_double_width._M_elems + 6));
        puVar17 = math::wide_integer::detail::advance_and_point<unsigned_short_const*,unsigned_int>
                            (puVar13,(uint)__range4);
        puVar13 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                            ((array<unsigned_short,_16UL> *)(bits_double_width._M_elems + 6));
        hi = math::wide_integer::detail::advance_and_point<unsigned_short_const*,unsigned_int>
                       (puVar13,uVar7);
        uVar7 = math::wide_integer::detail::make_large<unsigned_short,unsigned_int>(puVar17,hi);
        *__end4 = uVar7;
        __range4._0_4_ = (uint)__range4 + 2;
      }
      val_boost_2.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      ._40_8_ = 0;
      puVar2 = &val_boost_2.m_backend.
                super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .field_0x28;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2);
      pnVar3 = (number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                *)(str_uintwide_t_2.field_2._M_local_buf + 8);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
      ::number((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)pnVar3);
      this = (array<unsigned_int,_8UL> *)((long)&__range4 + 4);
      pvVar18 = std::array<unsigned_int,_8UL>::cbegin(this);
      pvVar19 = std::array<unsigned_int,_8UL>::cend(this);
      math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2,pvVar18,pvVar19,0x20,
                 (bool)(*__end1_2 & 1));
      pvVar18 = std::array<unsigned_int,_8UL>::cbegin(this);
      pvVar19 = std::array<unsigned_int,_8UL>::cend(this);
      in_R8 = (ulong)(*__end1_2 & 1);
      boost::multiprecision::
      import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)pnVar3,pvVar18,pvVar19,0x20,SUB41(*__end1_2 & 1,0));
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)((long)&str_boost_2.field_2 + 8),(wide_integer *)puVar2,x_01);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
      ::str_abi_cxx11_((string *)local_388,pnVar3,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&str_boost_2.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_388);
      local_5a9 = false;
      if (_Var5) {
        local_5a9 = __range1._7_1_;
      }
      __range1._7_1_ = local_5a9;
      std::__cxx11::string::~string((string *)local_388);
      std::__cxx11::string::~string((string *)(str_boost_2.field_2._M_local_buf + 8));
    }
  }
  __end1_3 = std::array<bool,_2UL>::begin(&test_import_bits::msv_options);
  pvVar9 = std::array<bool,_2UL>::end(&test_import_bits::msv_options);
  for (; __end1_3 != pvVar9; __end1_3 = __end1_3 + 1) {
    u_gen_3.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    u_gen_3.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    for (; (uint)u_gen_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x40;
        u_gen_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
             u_gen_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)(bits_3._M_elems + 10),
                 (test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
      memset(bits_double_width_1._M_elems + 5,0,0x1c);
      paVar20 = &math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::crepresentation
                           ((uintwide_t<256U,_unsigned_short,_void,_false> *)(bits_3._M_elems + 10))
                 ->super_array<unsigned_short,_16UL>;
      puVar13 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                          (paVar20);
      paVar20 = &math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::crepresentation
                           ((uintwide_t<256U,_unsigned_short,_void,_false> *)(bits_3._M_elems + 10))
                 ->super_array<unsigned_short,_16UL>;
      puVar14 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::cbegin
                          (paVar20);
      puVar17 = math::wide_integer::detail::advance_and_point<unsigned_short_const*,unsigned_long>
                          (puVar14,0xe);
      __result = std::array<unsigned_short,_14UL>::begin
                           ((array<unsigned_short,_14UL> *)(bits_double_width_1._M_elems + 5));
      std::copy<unsigned_short_const*,unsigned_short*>(puVar13,puVar17,__result);
      __range4_1._0_4_ = 0;
      __end4_1 = std::array<unsigned_int,_7UL>::begin
                           ((array<unsigned_int,_7UL> *)((long)&__range4_1 + 4));
      pvVar21 = std::array<unsigned_int,_7UL>::end
                          ((array<unsigned_int,_7UL> *)((long)&__range4_1 + 4));
      for (; __end4_1 != pvVar21; __end4_1 = __end4_1 + 1) {
        uVar7 = (uint)__range4_1 + 1;
        lo = std::array<unsigned_short,_14UL>::operator[]
                       ((array<unsigned_short,_14UL> *)(bits_double_width_1._M_elems + 5),
                        (ulong)(uint)__range4_1);
        hi_00 = std::array<unsigned_short,_14UL>::operator[]
                          ((array<unsigned_short,_14UL> *)(bits_double_width_1._M_elems + 5),
                           (ulong)uVar7);
        uVar7 = math::wide_integer::detail::make_large<unsigned_short,unsigned_int>(lo,hi_00);
        *__end4_1 = uVar7;
        __range4_1._0_4_ = (uint)__range4_1 + 2;
      }
      val_boost_3.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      ._40_8_ = 0;
      puVar2 = &val_boost_3.m_backend.
                super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                .field_0x28;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2);
      pnVar3 = (number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                *)(str_uintwide_t_3.field_2._M_local_buf + 8);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
      ::number((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)pnVar3);
      this_00 = (array<unsigned_int,_7UL> *)((long)&__range4_1 + 4);
      pvVar22 = std::array<unsigned_int,_7UL>::cbegin(this_00);
      pvVar23 = std::array<unsigned_int,_7UL>::cend(this_00);
      math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)puVar2,pvVar22,pvVar23,0x20,
                 (bool)(*__end1_3 & 1));
      pvVar22 = std::array<unsigned_int,_7UL>::cbegin(this_00);
      pvVar23 = std::array<unsigned_int,_7UL>::cend(this_00);
      in_R8 = (ulong)(*__end1_3 & 1);
      boost::multiprecision::
      import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)pnVar3,pvVar22,pvVar23,0x20,SUB41(*__end1_3 & 1,0));
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)((long)&str_boost_3.field_2 + 8),(wide_integer *)puVar2,x_02);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
      ::str_abi_cxx11_((string *)&bits_in,pnVar3,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      i_4._7_1_ = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&str_boost_3.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&bits_in);
      local_5f9 = false;
      if ((bool)i_4._7_1_) {
        local_5f9 = __range1._7_1_;
      }
      __range1._7_1_ = local_5f9;
      std::__cxx11::string::~string((string *)&bits_in);
      std::__cxx11::string::~string((string *)(str_boost_3.field_2._M_local_buf + 8));
    }
  }
  i_4._0_4_ = 0x5555aaaa;
  u.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  u.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  u.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  for (; uVar4 = u.values.super_array<unsigned_short,_16UL>.elems._24_8_,
      sVar24 = std::array<unsigned_int,_4UL>::size(&test_import_bits::various_chunk_sizes),
      (ulong)uVar4 < sVar24;
      u.values.super_array<unsigned_short,_16UL>.elems._24_8_ =
           u.values.super_array<unsigned_short,_16UL>.elems._24_8_ + 1) {
    memset(local_4f8,0,0x20);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_4f8);
    first = std::array<unsigned_int,_1UL>::cbegin((array<unsigned_int,_1UL> *)&i_4);
    last = std::array<unsigned_int,_1UL>::cend((array<unsigned_int,_1UL> *)&i_4);
    pvVar25 = std::array<unsigned_int,_4UL>::operator[]
                        (&test_import_bits::various_chunk_sizes,
                         u.values.super_array<unsigned_short,_16UL>.elems._24_8_);
    math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_4f8,first,last,*pvVar25,true);
    pvVar25 = std::array<unsigned_int,_4UL>::operator[]
                        (&test_import_bits::various_import_results,
                         u.values.super_array<unsigned_short,_16UL>.elems._24_8_);
    eVar6 = math::wide_integer::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_4f8,pvVar25);
    local_609 = false;
    if (eVar6) {
      local_609 = __range1._7_1_;
    }
    __range1._7_1_ = local_609;
  }
  return __range1._7_1_;
}

Assistant:

auto test_import_bits() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  using local_boost_small_uint_backend_type =
    boost::multiprecision::cpp_int_backend<local_edge_cases::local_digits2_small,
                                           local_edge_cases::local_digits2_small,
                                           boost::multiprecision::unsigned_magnitude,
                                           boost::multiprecision::unchecked,
                                           void>;

  using local_boost_small_uint_type =
    boost::multiprecision::number<local_boost_small_uint_backend_type,
                                  boost::multiprecision::et_off>;

  auto result_is_ok = true;

  static const std::array<bool, static_cast<std::size_t>(UINT8_C(2))> msv_options = { true, false };

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having the same widths.
      // Use the full bit width and representation length of uintwide_t.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;
      using local_input_value_type    = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      if(msv_first)
      {
        std::reverse(bits.begin(), bits.end());
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      const auto oscillated_chunk_size =
        static_cast<unsigned>
        (
          static_cast<unsigned>(i % 2U) == 0U
            ? static_cast<unsigned>(std::numeric_limits<local_input_value_type>::digits)
            : 0U
        );

      static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first));
      static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first)); // NOLINT

      using std::to_string;

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      = val_boost.str();

      const auto result_import_bits_is_ok = ((str_uintwide_t == str_boost) && (u_gen == val_uintwide_t));

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    static const std::array<unsigned, static_cast<std::size_t>(UINT8_C(3))> bits_for_chunks = { 7U, 9U, 15U };

    for(const auto& chunk_size : bits_for_chunks)
    {
      for(auto   i = static_cast<unsigned>(UINT8_C(0));
                 i < static_cast<unsigned>(loop_count_lo);
               ++i)
      {
        // Verify import_bits() and compare with Boost control value(s).
        // The input and output ranges have elements having the same widths.
        // Use various input bit counts less than the result limb's width.
        // Use the full size of elements in the wide integer for the
        // distance of the input range.

        using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

        auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

        local_representation_type bits(u_gen.crepresentation());

        if(msv_first)
        {
          std::reverse(bits.begin(), bits.end());
        }

        local_uintwide_t_small_unsigned_type val_uintwide_t { };
        local_boost_small_uint_type          val_boost      { };

        using std::to_string;

        static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), chunk_size, msv_first));
        static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), chunk_size, msv_first)); // NOLINT

        const auto str_uintwide_t = to_string(val_uintwide_t);
        const auto str_boost      =           val_boost.str();

        const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

        result_is_ok = (result_import_bits_is_ok && result_is_ok);
      }
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having different widths.
      // Use various input bit counts exceeding the result limb's width.
      // Use the full size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_input_array_type =
        std::array<local_input_double_width_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs / 2U>;

      local_double_width_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          #if defined(WIDE_INTEGER_NAMESPACE)
          elem = make_large(*WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #else
          elem = make_large(*::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #endif

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // Use various input bit counts exceeding the result limb's width.
      // Use only part of the size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      using local_representation_less_wide_type =
        std::array<local_input_value_type, static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) - 2U)>;

      local_representation_less_wide_type bits { };

      std::copy(u_gen.crepresentation().cbegin(),
                #if defined(WIDE_INTEGER_NAMESPACE)
                WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #else
                ::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #endif
                bits.begin());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_less_wide_input_array_type =
        std::array<local_input_double_width_value_type, std::tuple_size<local_representation_less_wide_type>::value / 2U>;

      static_assert(std::tuple_size<local_double_width_less_wide_input_array_type>::value == static_cast<std::size_t>(static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) / 2U) - 1U),
                    "Error: Type definition widths are not OK");

      local_double_width_less_wide_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          elem = make_large(bits[index], bits[index_plus_one]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  {
    // Additional verification of import_bits().

    const std::array<std::uint32_t, 1U> bits_in = { static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)) };

    using chunk_sizes_array_type = std::array<unsigned, static_cast<std::size_t>(UINT8_C(4))>;

    static const chunk_sizes_array_type various_chunk_sizes =
    {
      0U, 32U, 24U, 2U
    };

    static const std::array<std::uint32_t, std::tuple_size<chunk_sizes_array_type>::value> various_import_results =
    {
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x0055AAAA)),
      static_cast<std::uint32_t>(UINT32_C(2))
    };

    for(auto i = static_cast<std::size_t>(UINT8_C(0)); i < various_chunk_sizes.size(); ++i)
    {
      auto u = local_uintwide_t_small_unsigned_type { };

      static_cast<void>
      (
        import_bits(u, bits_in.cbegin(), bits_in.cend(), various_chunk_sizes[i]) // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)
      );

      const auto result_import_is_ok = (u == various_import_results[i]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

      result_is_ok = (result_import_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}